

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O2

void __thiscall
features::Sift::add_octave(Sift *this,ConstPtr *image,float has_sigma,float target_sigma)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pOVar1;
  int iVar2;
  float fVar3;
  undefined1 auStack_138 [8];
  Ptr img;
  __shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> local_c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  image local_b0 [8];
  Ptr dog;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  Sift *local_80;
  pointer local_78;
  ImageVector *local_70;
  Ptr *local_68;
  Ptr *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_58;
  float local_4c;
  undefined1 local_48 [8];
  Ptr base;
  
  fVar3 = target_sigma * target_sigma - has_sigma * has_sigma;
  base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       target_sigma;
  if (fVar3 < 0.0) {
    base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
         = has_sigma;
    fVar3 = sqrtf(fVar3);
    has_sigma = base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_4_;
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  if (base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ <= has_sigma) {
    core::Image<float>::duplicate((Image<float> *)local_48);
  }
  else {
    base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
         = fVar3;
    std::__shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d0,
               &image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>);
    core::image::blur_gaussian<float>
              ((image *)local_48,(ConstPtr *)&local_d0,
               base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._4_4_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
  }
  local_60 = &base;
  img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auStack_138 = (undefined1  [8])0x0;
  img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::
  emplace_back<features::Sift::Octave>(&this->octaves,(Octave *)auStack_138);
  Octave::~Octave((Octave *)auStack_138);
  pOVar1 = (this->octaves).
           super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_78 = pOVar1 + -1;
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::push_back(&local_78->img,(value_type *)local_48);
  local_80 = this;
  local_4c = exp2f(1.0 / (float)(this->options).num_samples_per_octave);
  local_58 = &local_98;
  local_70 = &pOVar1[-1].dog;
  local_68 = &img;
  fVar3 = base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_;
  for (iVar2 = 1; iVar2 < (local_80->options).num_samples_per_octave + 3; iVar2 = iVar2 + 1) {
    base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
         = local_4c * fVar3;
    fVar3 = base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_ *
            base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_ - fVar3 * fVar3;
    if (fVar3 < 0.0) {
      base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = sqrtf(fVar3);
    }
    else {
      base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = SQRT(fVar3);
    }
    std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<core::Image<float>,void>
              (local_c0,(__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    core::image::blur_gaussian<float>
              ((image *)auStack_138,(ConstPtr *)local_c0,
               base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._0_4_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
    std::
    vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
    ::push_back(&local_78->img,(value_type *)auStack_138);
    this_00 = &dog.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<core::Image<float>,void>
              ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)auStack_138);
    std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<core::Image<float>,void>
              (local_90,(__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    core::image::subtract<float>(local_b0,(ConstPtr *)this_00,(ConstPtr *)local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
    std::
    vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
    ::push_back(local_70,(value_type *)local_b0);
    std::__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)local_48,
               (__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)auStack_138);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&dog);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&img);
    fVar3 = base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&base);
  return;
}

Assistant:

void
Sift::add_octave (core::FloatImage::ConstPtr image,
        float has_sigma, float target_sigma)
{
    /*
     * First, bring the provided image to the target blur.
     * Since L * g(sigma1) * g(sigma2) = L * g(sqrt(sigma1^2 + sigma2^2)),
     * we need to blur with sigma = sqrt(target_sigma^2 - has_sigma^2).
     */
    float sigma = std::sqrt(MATH_POW2(target_sigma) - MATH_POW2(has_sigma));
    //std::cout << "Pre-blurring image to sigma " << target_sigma << " (has "
    //    << has_sigma << ", blur = " << sigma << ")..." << std::endl;
    core::FloatImage::Ptr base = (target_sigma > has_sigma
        ? core::image::blur_gaussian<float>(image, sigma)
        : image->duplicate());

    /* Create the new octave and add initial image. */
    this->octaves.push_back(Octave());
    Octave& oct = this->octaves.back();
    oct.img.push_back(base);

    /* 'k' is the constant factor between the scales in scale space. */
    float const k = std::pow(2.0f, 1.0f / this->options.num_samples_per_octave);
    sigma = target_sigma;

    /* Create other (s+2) samples of the octave to get a total of (s+3). */
    for (int i = 1; i < this->options.num_samples_per_octave + 3; ++i)
    {
        /* Calculate the blur sigma the image will get. */
        float sigmak = sigma * k;
        float blur_sigma = std::sqrt(MATH_POW2(sigmak) - MATH_POW2(sigma));

        /* Blur the image to create a new scale space sample. */
        //std::cout << "Blurring image to sigma " << sigmak << " (has " << sigma
        //    << ", blur = " << blur_sigma << ")..." << std::endl;
        core::FloatImage::Ptr img = core::image::blur_gaussian<float>
            (base, blur_sigma);
        oct.img.push_back(img);

        /* Create the Difference of Gaussian image (DoG). */
        //计算差分拉普拉斯 // todo revised by sway
        core::FloatImage::Ptr dog = core::image::subtract<float>(img, base);
        oct.dog.push_back(dog);

        /* Update previous image and sigma for next round. */
        base = img;
        sigma = sigmak;
    }
}